

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O0

void __thiscall read_env_var::test_method(read_env_var *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  size_type local_11a0;
  undefined4 local_1194;
  basic_cstring<const_char> local_1190;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1180;
  basic_cstring<const_char> local_1158;
  basic_cstring<const_char> local_1148;
  basic_cstring<const_char> local_1138;
  basic_cstring<const_char> local_1128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1118;
  assertion_result local_10f8;
  basic_cstring<const_char> local_10e0;
  basic_cstring<const_char> local_10d0 [2];
  allocator local_10a9;
  string local_10a8;
  undefined1 local_1088 [8];
  EventRegistry registry;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  LicenseReader licenseReader;
  LicenseLocation location;
  char local_1018 [8];
  char str [4096];
  read_env_var *this_local;
  
  strcpy(local_1018,
         "LIC_VAR=/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/test_reader.ini"
        );
  putenv(local_1018);
  licenseReader.licenseLocation.openFileNearModule = false;
  licenseReader.licenseLocation._17_7_ = 0;
  license::LicenseReader::LicenseReader
            ((LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (LicenseLocation *)&licenseReader.licenseLocation.openFileNearModule);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10a8,"PrODUCT",&local_10a9);
  license::LicenseReader::readLicenses
            ((EventRegistry *)local_1088,
             (LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_10a8,
             (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_10a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a9);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_10d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_10e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_10d0,0x4c,&local_10e0);
    bVar2 = license::EventRegistry::isGood((EventRegistry *)local_1088);
    boost::test_tools::assertion_result::assertion_result(&local_10f8,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1128,"registry.isGood()",0x11);
    boost::unit_test::operator<<(&local_1118,plVar3,&local_1128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7a);
    boost::test_tools::tt_detail::report_assertion(&local_10f8,&local_1118,&local_1138,0x4c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1118);
    boost::test_tools::assertion_result::~assertion_result(&local_10f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1158);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1148,0x4d,&local_1158);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1180,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7a);
    local_1194 = 1;
    local_11a0 = std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
                 size((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *
                      )&registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
              (&local_1180,&local_1190,0x4d,1,2,&local_1194,"1",&local_11a0,"licenseInfos.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1180);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  license::EventRegistry::~EventRegistry((EventRegistry *)local_1088);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  license::LicenseReader::~LicenseReader
            ((LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( read_env_var ) {
	char str[MAX_PATH];
	strcpy(str,"LIC_VAR=" PROJECT_TEST_SRC_DIR "/library/test_reader.ini");
	putenv(str);
	const LicenseLocation location = { NULL, "LIC_VAR", false };
	LicenseReader licenseReader(location);
	vector<FullLicenseInfo> licenseInfos;
	EventRegistry registry = licenseReader.readLicenses("PrODUCT",
			licenseInfos);
	BOOST_CHECK(registry.isGood());
	BOOST_CHECK_EQUAL(1, licenseInfos.size());
}